

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextureBaseGL.cpp
# Opt level: O2

void __thiscall
Diligent::TextureBaseGL::TextureBaseGL
          (TextureBaseGL *this,IReferenceCounters *pRefCounters,
          FixedBlockMemoryAllocator *TexViewObjAllocator,RenderDeviceGLImpl *pDeviceGL,
          GLContextState *GLState,TextureDesc *TexDesc,GLuint GLTextureHandle,GLenum BindTarget,
          bool bIsDeviceInternal)

{
  TEXTURE_FORMAT TexFormat;
  RENDER_DEVICE_TYPE RVar1;
  uint uVar2;
  GLint GVar3;
  GLenum GVar4;
  GLenum GVar5;
  TextureFormatAttribs *Args;
  long lVar6;
  TextureDesc *pTVar7;
  string *psVar8;
  char *Args_2;
  bool bVar9;
  bool bVar10;
  byte bVar11;
  char (*in_stack_fffffffffffffee8) [2];
  GLint GlFormat;
  GLint MipLevels;
  GLint TexWidth;
  string msg;
  string msg_6;
  GLenum err_4;
  GLTextureObj TmpGLTexWrapper;
  
  bVar11 = 0;
  pTVar7 = TexDesc;
  psVar8 = &msg_6;
  for (lVar6 = 10; lVar6 != 0; lVar6 = lVar6 + -1) {
    (psVar8->_M_dataplus)._M_p = (pTVar7->super_DeviceObjectAttribs).Name;
    pTVar7 = (TextureDesc *)&pTVar7->Type;
    psVar8 = (string *)&psVar8->_M_string_length;
  }
  Args_2 = (char *)GLState;
  if (BindTarget == 0x9009) {
    FormatString<char[43]>(&msg,(char (*) [43])"Cubemap arrays are not currently supported");
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"GetTextureDescFromGLHandle",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureBaseGL.cpp"
               ,0x99);
    std::__cxx11::string::~string((string *)&msg);
  }
  GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLTextureCreateReleaseHelper>::GLObjWrapper
            (&TmpGLTexWrapper,true,(GLTextureCreateReleaseHelper)GLTextureHandle);
  GLContextState::BindTexture(GLState,-1,BindTarget,&TmpGLTexWrapper);
  GVar4 = 0x8515;
  if (BindTarget != 0x8513) {
    GVar4 = BindTarget;
  }
  TexWidth = 0;
  RVar1 = (pDeviceGL->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_DeviceInfo.Type;
  if (RVar1 == RENDER_DEVICE_TYPE_GL) {
LAB_002e98b1:
    glGetTexLevelParameteriv(GVar4,0,0x1000,(char (*) [68])&TexWidth);
    GlFormat = glGetError();
    if (GlFormat != 0) {
      Args_2 = "glGetTexLevelParameteriv(GL_TEXTURE_WIDTH) failed";
      LogError<false,char[50],char[17],unsigned_int>
                (false,"GetTextureDescFromGLHandle",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureBaseGL.cpp"
                 ,0xa7,(char (*) [50])"glGetTexLevelParameteriv(GL_TEXTURE_WIDTH) failed",
                 (char (*) [17])"\nGL Error Code: ",(uint *)&GlFormat);
      FormatString<char[6]>(&msg,(char (*) [6])0x731c01);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"GetTextureDescFromGLHandle",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureBaseGL.cpp"
                 ,0xa7);
      std::__cxx11::string::~string((string *)&msg);
    }
    if (TexWidth < 1) goto LAB_002e99d2;
    if (msg_6._M_string_length._4_4_ != TexWidth && msg_6._M_string_length._4_4_ != 0) {
      Args_2 = (char *)&msg_6;
      FormatString<char[12],unsigned_int,char[15],char_const*,char[68],int,char[2]>
                (&msg,(Diligent *)"The width (",(char (*) [12])((long)&msg_6._M_string_length + 4),
                 (uint *)") of texture \'",(char (*) [15])Args_2,
                 (char **)"\' specified by TextureDesc struct does not match the actual width (",
                 (char (*) [68])&TexWidth,(int *)0x801c00,in_stack_fffffffffffffee8);
      if (DebugMessageCallback != (undefined *)0x0) {
        Args_2 = (char *)0x0;
        (*(code *)DebugMessageCallback)(1,msg._M_dataplus._M_p,0,0);
      }
      std::__cxx11::string::~string((string *)&msg);
    }
    msg_6._M_string_length._4_4_ = TexWidth;
  }
  else {
    if (RVar1 == RENDER_DEVICE_TYPE_GLES) {
      uVar2 = (pDeviceGL->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_DeviceInfo.
              APIVersion.Major;
      bVar9 = 2 < uVar2;
      if (uVar2 == 3) {
        bVar9 = (pDeviceGL->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_DeviceInfo.
                APIVersion.Minor != 0;
      }
      if (bVar9) goto LAB_002e98b1;
    }
LAB_002e99d2:
    if (msg_6._M_string_length._4_4_ == 0) {
      FormatString<char[39],char_const*,char[53]>
                (&msg,(Diligent *)"Unable to query the width of texture \'",(char (*) [39])&msg_6,
                 (char **)"\' while the Width member of TextureDesc struct is 0.",
                 (char (*) [53])Args_2);
      if (DebugMessageCallback != (undefined *)0x0) {
        Args_2 = (char *)0x0;
        (*(code *)DebugMessageCallback)(1,msg._M_dataplus._M_p,0,0);
      }
      std::__cxx11::string::~string((string *)&msg);
    }
  }
  if ((byte)msg_6._M_string_length < 4) {
    msg_6.field_2._M_allocated_capacity._0_4_ = 1;
  }
  else {
    GlFormat = 0;
    RVar1 = (pDeviceGL->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_DeviceInfo.Type;
    if (RVar1 == RENDER_DEVICE_TYPE_GL) {
LAB_002e9a72:
      glGetTexLevelParameteriv(GVar4,0,0x1001,(char (*) [69])&GlFormat);
      MipLevels = glGetError();
      if (MipLevels != 0) {
        Args_2 = "glGetTexLevelParameteriv(GL_TEXTURE_HEIGHT) failed";
        LogError<false,char[51],char[17],unsigned_int>
                  (false,"GetTextureDescFromGLHandle",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureBaseGL.cpp"
                   ,0xcb,(char (*) [51])"glGetTexLevelParameteriv(GL_TEXTURE_HEIGHT) failed",
                   (char (*) [17])"\nGL Error Code: ",(uint *)&MipLevels);
        FormatString<char[6]>(&msg,(char (*) [6])0x731c01);
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"GetTextureDescFromGLHandle",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureBaseGL.cpp"
                   ,0xcb);
        std::__cxx11::string::~string((string *)&msg);
      }
      if (GlFormat < 1) goto LAB_002e9ba3;
      bVar9 = msg_6.field_2._M_allocated_capacity._0_4_ != 0;
      bVar10 = msg_6.field_2._M_allocated_capacity._0_4_ != GlFormat;
      msg_6.field_2._M_allocated_capacity._0_4_ = GlFormat;
      if (bVar10 && bVar9) {
        Args_2 = (char *)&msg_6;
        FormatString<char[13],unsigned_int,char[15],char_const*,char[69],int,char[2]>
                  (&msg,(Diligent *)"The height (",(char (*) [13])&msg_6.field_2,
                   (uint *)") of texture \'",(char (*) [15])Args_2,
                   (char **)"\' specified by TextureDesc struct does not match the actual height (",
                   (char (*) [69])&GlFormat,(int *)0x801c00,in_stack_fffffffffffffee8);
        if (DebugMessageCallback != (undefined *)0x0) {
          Args_2 = (char *)0x0;
          (*(code *)DebugMessageCallback)(1,msg._M_dataplus._M_p,0,0);
        }
        std::__cxx11::string::~string((string *)&msg);
        msg_6.field_2._M_allocated_capacity._0_4_ = GlFormat;
      }
    }
    else {
      if (RVar1 == RENDER_DEVICE_TYPE_GLES) {
        uVar2 = (pDeviceGL->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_DeviceInfo.
                APIVersion.Major;
        bVar9 = 2 < uVar2;
        if (uVar2 == 3) {
          bVar9 = (pDeviceGL->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_DeviceInfo.
                  APIVersion.Minor != 0;
        }
        if (bVar9) goto LAB_002e9a72;
      }
LAB_002e9ba3:
      if (msg_6.field_2._M_allocated_capacity._0_4_ == 0) {
        FormatString<char[40],char_const*,char[54]>
                  (&msg,(Diligent *)"Unable to query the height of texture \'",(char (*) [40])&msg_6
                   ,(char **)"\' while the Height member of TextureDesc struct is 0.",
                   (char (*) [54])Args_2);
        if (DebugMessageCallback != (undefined *)0x0) {
          Args_2 = (char *)0x0;
          (*(code *)DebugMessageCallback)(1,msg._M_dataplus._M_p,0,0);
        }
        std::__cxx11::string::~string((string *)&msg);
      }
    }
    if ((byte)msg_6._M_string_length == 6) {
      GlFormat = 0;
      RVar1 = (pDeviceGL->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_DeviceInfo.Type;
      if (RVar1 == RENDER_DEVICE_TYPE_GL) {
LAB_002e9c43:
        glGetTexLevelParameteriv(GVar4,0,0x8071,(char (*) [68])&GlFormat);
        MipLevels = glGetError();
        if (MipLevels != 0) {
          Args_2 = "glGetTexLevelParameteriv(GL_TEXTURE_DEPTH) failed";
          LogError<false,char[50],char[17],unsigned_int>
                    (false,"GetTextureDescFromGLHandle",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureBaseGL.cpp"
                     ,0xf2,(char (*) [50])"glGetTexLevelParameteriv(GL_TEXTURE_DEPTH) failed",
                     (char (*) [17])"\nGL Error Code: ",(uint *)&MipLevels);
          FormatString<char[6]>(&msg,(char (*) [6])0x731c01);
          DebugAssertionFailed
                    (msg._M_dataplus._M_p,"GetTextureDescFromGLHandle",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureBaseGL.cpp"
                     ,0xf2);
          std::__cxx11::string::~string((string *)&msg);
        }
        if (0 < GlFormat) {
          bVar9 = msg_6.field_2._M_allocated_capacity._4_4_ != 0;
          bVar10 = msg_6.field_2._M_allocated_capacity._4_4_ != GlFormat;
          msg_6.field_2._M_allocated_capacity._4_4_ = GlFormat;
          if (bVar10 && bVar9) {
            Args_2 = (char *)&msg_6;
            FormatString<char[12],unsigned_int,char[15],char_const*,char[68],int,char[2]>
                      (&msg,(Diligent *)"The depth (",(char (*) [12])((long)&msg_6.field_2 + 4),
                       (uint *)") of texture \'",(char (*) [15])Args_2,
                       (char **)
                       "\' specified by TextureDesc struct does not match the actual depth (",
                       (char (*) [68])&GlFormat,(int *)0x801c00,in_stack_fffffffffffffee8);
            if (DebugMessageCallback != (undefined *)0x0) {
              Args_2 = (char *)0x0;
              (*(code *)DebugMessageCallback)(1,msg._M_dataplus._M_p,0,0);
            }
            std::__cxx11::string::~string((string *)&msg);
            msg_6.field_2._M_allocated_capacity._4_4_ = GlFormat;
          }
          goto LAB_002e9dbc;
        }
      }
      else if (RVar1 == RENDER_DEVICE_TYPE_GLES) {
        uVar2 = (pDeviceGL->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_DeviceInfo.
                APIVersion.Major;
        bVar9 = 2 < uVar2;
        if (uVar2 == 3) {
          bVar9 = (pDeviceGL->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_DeviceInfo.
                  APIVersion.Minor != 0;
        }
        if (bVar9) goto LAB_002e9c43;
      }
      if (msg_6.field_2._M_allocated_capacity._4_4_ == 0) {
        FormatString<char[39],char_const*,char[53]>
                  (&msg,(Diligent *)"Unable to query the depth of texture \'",(char (*) [39])&msg_6,
                   (char **)"\' while the Depth member of TextureDesc struct is 0.",
                   (char (*) [53])Args_2);
        if (DebugMessageCallback != (undefined *)0x0) {
          Args_2 = (char *)0x0;
          (*(code *)DebugMessageCallback)(1,msg._M_dataplus._M_p,0,0);
        }
        std::__cxx11::string::~string((string *)&msg);
      }
    }
  }
LAB_002e9dbc:
  if (((byte)msg_6._M_string_length == 4) || ((byte)msg_6._M_string_length == 2)) {
    msg_6.field_2._M_allocated_capacity._4_4_ = 1;
  }
  GlFormat = 0;
  RVar1 = (pDeviceGL->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_DeviceInfo.Type;
  if (RVar1 == RENDER_DEVICE_TYPE_GL) {
LAB_002e9e13:
    glGetTexLevelParameteriv(GVar4,0,0x1003,(char (*) [78])&GlFormat);
    MipLevels = glGetError();
    if (MipLevels != 0) {
      Args_2 = "glGetTexLevelParameteriv(GL_TEXTURE_INTERNAL_FORMAT) failed";
      LogError<false,char[60],char[17],unsigned_int>
                (false,"GetTextureDescFromGLHandle",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureBaseGL.cpp"
                 ,0x116,(char (*) [60])"glGetTexLevelParameteriv(GL_TEXTURE_INTERNAL_FORMAT) failed"
                 ,(char (*) [17])"\nGL Error Code: ",(uint *)&MipLevels);
      FormatString<char[6]>(&msg,(char (*) [6])0x731c01);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"GetTextureDescFromGLHandle",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureBaseGL.cpp"
                 ,0x116);
      std::__cxx11::string::~string((string *)&msg);
    }
    GVar3 = GlFormat;
    if (GlFormat == 0) goto LAB_002e9f4b;
    if ((msg_6.field_2._8_2_ != 0) &&
       (GVar4 = TexFormatToGLInternalTexFormat(msg_6.field_2._8_2_,0), GVar3 != GVar4)) {
      Args = GetTextureFormatAttribs(msg_6.field_2._8_2_);
      Args_2 = (char *)&msg_6;
      FormatString<char[13],char_const*,char[15],char_const*,char[78],int,char[2]>
                (&msg,(Diligent *)"The format (",(char (*) [13])Args,(char **)") of texture \'",
                 (char (*) [15])Args_2,
                 (char **)
                 "\' specified by TextureDesc struct does not match GL texture internal format (",
                 (char (*) [78])&GlFormat,(int *)0x801c00,in_stack_fffffffffffffee8);
      if (DebugMessageCallback != (undefined *)0x0) {
        Args_2 = (char *)0x0;
        (*(code *)DebugMessageCallback)(1,msg._M_dataplus._M_p,0,0);
      }
      std::__cxx11::string::~string((string *)&msg);
    }
    msg_6.field_2._8_2_ = GLInternalTexFormatToTexFormat(GlFormat);
  }
  else {
    if (RVar1 == RENDER_DEVICE_TYPE_GLES) {
      uVar2 = (pDeviceGL->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_DeviceInfo.
              APIVersion.Major;
      bVar9 = 2 < uVar2;
      if (uVar2 == 3) {
        bVar9 = (pDeviceGL->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_DeviceInfo.
                APIVersion.Minor != 0;
      }
      if (bVar9) goto LAB_002e9e13;
    }
LAB_002e9f4b:
    if (msg_6.field_2._8_2_ == 0) {
      FormatString<char[40],char_const*,char[71]>
                (&msg,(Diligent *)"Unable to query the format of texture \'",(char (*) [40])&msg_6,
                 (char **)"\' while the Format member of TextureDesc struct is TEX_FORMAT_UNKNOWN.",
                 (char (*) [71])Args_2);
      if (DebugMessageCallback != (undefined *)0x0) {
        Args_2 = (char *)0x0;
        (*(code *)DebugMessageCallback)(1,msg._M_dataplus._M_p,0,0);
      }
      std::__cxx11::string::~string((string *)&msg);
    }
  }
  MipLevels = 0;
  RVar1 = (pDeviceGL->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_DeviceInfo.Type;
  if (RVar1 == RENDER_DEVICE_TYPE_GLES) {
LAB_002e9fdd:
    glGetTexParameteriv(BindTarget,0x82df,(char (*) [83])&MipLevels);
    err_4 = glGetError();
    if (err_4 != 0) {
      Args_2 = "glGetTexParameteriv(GL_TEXTURE_IMMUTABLE_LEVELS) failed";
      LogError<false,char[56],char[17],unsigned_int>
                (false,"GetTextureDescFromGLHandle",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureBaseGL.cpp"
                 ,0x137,(char (*) [56])"glGetTexParameteriv(GL_TEXTURE_IMMUTABLE_LEVELS) failed",
                 (char (*) [17])"\nGL Error Code: ",&err_4);
      FormatString<char[6]>(&msg,(char (*) [6])0x731c01);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"GetTextureDescFromGLHandle",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureBaseGL.cpp"
                 ,0x137);
      std::__cxx11::string::~string((string *)&msg);
    }
    if (MipLevels < 1) goto LAB_002ea101;
    if (msg_6.field_2._12_4_ != MipLevels && msg_6.field_2._12_4_ != 0) {
      FormatString<char[27],unsigned_int,char[15],char_const*,char[83],int,char[2]>
                (&msg,(Diligent *)"The number of mip levels (",
                 (char (*) [27])((long)&msg_6.field_2 + 0xc),(uint *)") of texture \'",
                 (char (*) [15])&msg_6,
                 (char **)
                 "\' specified by TextureDesc struct does not match the actual number of mip levels ("
                 ,(char (*) [83])&MipLevels,(int *)0x801c00,in_stack_fffffffffffffee8);
      if (DebugMessageCallback != (undefined *)0x0) {
        (*(code *)DebugMessageCallback)(1,msg._M_dataplus._M_p,0,0,0);
      }
      std::__cxx11::string::~string((string *)&msg);
    }
    msg_6.field_2._12_4_ = MipLevels;
  }
  else {
    if (RVar1 == RENDER_DEVICE_TYPE_GL) {
      uVar2 = (pDeviceGL->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_DeviceInfo.
              APIVersion.Major;
      bVar9 = 3 < uVar2;
      if (uVar2 == 4) {
        bVar9 = 2 < (pDeviceGL->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_DeviceInfo.
                    APIVersion.Minor;
      }
      if (bVar9) goto LAB_002e9fdd;
    }
LAB_002ea101:
    if (msg_6.field_2._12_4_ == 0) {
      FormatString<char[49],char_const*,char[57]>
                (&msg,(Diligent *)"Unable to query the mip level count of texture \'",
                 (char (*) [49])&msg_6,
                 (char **)"\' while the MipLevels member of TextureDesc struct is 0.",
                 (char (*) [57])Args_2);
      if (DebugMessageCallback != (undefined *)0x0) {
        (*(code *)DebugMessageCallback)(1,msg._M_dataplus._M_p,0,0,0);
      }
      std::__cxx11::string::~string((string *)&msg);
    }
  }
  msg._M_dataplus._M_p = (pointer)0x0;
  msg._M_string_length._0_4_ = 0;
  GLContextState::BindTexture(GLState,-1,BindTarget,(GLTextureObj *)&msg);
  GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLTextureCreateReleaseHelper>::~GLObjWrapper
            ((GLObjWrapper<GLObjectWrappers::GLTextureCreateReleaseHelper> *)&msg);
  psVar8 = &msg_6;
  pTVar7 = (TextureDesc *)&msg;
  for (lVar6 = 10; lVar6 != 0; lVar6 = lVar6 + -1) {
    (pTVar7->super_DeviceObjectAttribs).Name = (psVar8->_M_dataplus)._M_p;
    psVar8 = (string *)((long)psVar8 + (ulong)bVar11 * -0x10 + 8);
    pTVar7 = (TextureDesc *)((long)pTVar7 + (ulong)bVar11 * -0x10 + 8);
  }
  GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLTextureCreateReleaseHelper>::~GLObjWrapper
            (&TmpGLTexWrapper);
  TextureBase<Diligent::EngineGLImplTraits>::TextureBase
            (&this->super_TextureBase<Diligent::EngineGLImplTraits>,pRefCounters,TexViewObjAllocator
             ,pDeviceGL,(TextureDesc *)&msg,bIsDeviceInternal);
  (this->super_AsyncWritableResource).m_PendingMemoryBarriers = MEMORY_BARRIER_NONE;
  (this->super_TextureBase<Diligent::EngineGLImplTraits>).
  super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>.
  super_ObjectBase<Diligent::ITextureGL>.super_RefCountedObject<Diligent::ITextureGL>.
  super_ITextureGL.super_ITexture.super_IDeviceObject = (IDeviceObject)&PTR_QueryInterface_00a583f0;
  GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLTextureCreateReleaseHelper>::GLObjWrapper
            (&this->m_GlTexture,true,(GLTextureCreateReleaseHelper)GLTextureHandle);
  (this->m_pPBO).m_pObject = (IBuffer *)0x0;
  this->m_BindTarget = BindTarget;
  TexFormat = TexDesc->Format;
  GLContextState::BindTexture(GLState,-1,BindTarget,&this->m_GlTexture);
  msg._M_dataplus._M_p = msg._M_dataplus._M_p & 0xffffffff00000000;
  GVar4 = BindTarget;
  if (BindTarget == 0x9009) {
    GVar4 = 0x8515;
  }
  if (BindTarget == 0x8513) {
    GVar4 = 0x8515;
  }
  RVar1 = (pDeviceGL->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_DeviceInfo.Type;
  if (RVar1 == RENDER_DEVICE_TYPE_GL) {
LAB_002ea27b:
    glGetTexLevelParameteriv(GVar4,0,0x1003,&msg);
    TmpGLTexWrapper.m_uiHandle = glGetError();
    if (TmpGLTexWrapper.m_uiHandle != 0) {
      LogError<false,char[60],char[17],unsigned_int>
                (false,"GetTextureInternalFormat",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureBaseGL.cpp"
                 ,0x68,(char (*) [60])"glGetTexLevelParameteriv(GL_TEXTURE_INTERNAL_FORMAT) failed",
                 (char (*) [17])"\nGL Error Code: ",&TmpGLTexWrapper.m_uiHandle);
      FormatString<char[6]>(&msg_6,(char (*) [6])0x731c01);
      DebugAssertionFailed
                (msg_6._M_dataplus._M_p,"GetTextureInternalFormat",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureBaseGL.cpp"
                 ,0x68);
      std::__cxx11::string::~string((string *)&msg_6);
    }
    if ((GLenum)msg._M_dataplus._M_p == 0) goto LAB_002ea369;
    GVar4 = (GLenum)msg._M_dataplus._M_p;
    if ((GLenum)msg._M_dataplus._M_p == 0x1908) {
      msg._M_dataplus._M_p._0_4_ = 0x8058;
      GVar4 = 0x8058;
    }
    if ((TexFormat == TEX_FORMAT_UNKNOWN) ||
       (GVar5 = TexFormatToGLInternalTexFormat(TexFormat,0), GVar4 == GVar5)) goto LAB_002ea3bb;
    FormatString<char[78]>
              (&msg_6,(char (*) [78])
                      "Texture format does not match the format specified by the texture description"
              );
    DebugAssertionFailed
              (msg_6._M_dataplus._M_p,"GetTextureInternalFormat",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureBaseGL.cpp"
               ,0x74);
  }
  else {
    if (RVar1 == RENDER_DEVICE_TYPE_GLES) {
      uVar2 = (pDeviceGL->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_DeviceInfo.
              APIVersion.Major;
      bVar9 = 2 < uVar2;
      if (uVar2 == 3) {
        bVar9 = (pDeviceGL->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_DeviceInfo.
                APIVersion.Minor != 0;
      }
      if (bVar9) goto LAB_002ea27b;
    }
LAB_002ea369:
    if (TexFormat != TEX_FORMAT_UNKNOWN) {
      GVar4 = TexFormatToGLInternalTexFormat(TexFormat,0);
      msg._M_dataplus._M_p._0_4_ = GVar4;
      goto LAB_002ea3bb;
    }
    FormatString<char[113]>
              (&msg_6,(char (*) [113])
                      "Unable to query internal texture format while the format specified by texture description is TEX_FORMAT_UNKNOWN."
              );
    if (DebugMessageCallback != (undefined *)0x0) {
      (*(code *)DebugMessageCallback)(1,msg_6._M_dataplus._M_p,0,0,0);
    }
  }
  std::__cxx11::string::~string((string *)&msg_6);
LAB_002ea3bb:
  msg_6._M_dataplus._M_p = (pointer)0x0;
  msg_6._M_string_length._0_4_ = 0;
  GLContextState::BindTexture(GLState,-1,BindTarget,(GLTextureObj *)&msg_6);
  GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLTextureCreateReleaseHelper>::~GLObjWrapper
            ((GLObjWrapper<GLObjectWrappers::GLTextureCreateReleaseHelper> *)&msg_6);
  this->m_GLTexFormat = (GLenum)msg._M_dataplus._M_p;
  return;
}

Assistant:

TextureBaseGL::TextureBaseGL(IReferenceCounters*        pRefCounters,
                             FixedBlockMemoryAllocator& TexViewObjAllocator,
                             RenderDeviceGLImpl*        pDeviceGL,
                             GLContextState&            GLState,
                             const TextureDesc&         TexDesc,
                             GLuint                     GLTextureHandle,
                             GLenum                     BindTarget,
                             bool                       bIsDeviceInternal /* = false*/) :
    // clang-format off
    TTextureBase
    {
        pRefCounters,
        TexViewObjAllocator,
        pDeviceGL,
        GetTextureDescFromGLHandle(pDeviceGL->GetDeviceInfo(), GLState, TexDesc, GLTextureHandle, BindTarget),
        bIsDeviceInternal
    },
    // Create texture object wrapper, but use external texture handle
    m_GlTexture     {true, GLObjectWrappers::GLTextureCreateReleaseHelper(GLTextureHandle)},
    m_BindTarget    {BindTarget},
    m_GLTexFormat   {GetTextureInternalFormat(pDeviceGL->GetDeviceInfo(), GLState, BindTarget, m_GlTexture, TexDesc.Format)}
// clang-format on
{
}